

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * computeIndexAffStr(sqlite3 *db,Index *pIdx)

{
  short sVar1;
  void *pvVar2;
  long in_RSI;
  char aff;
  i16 x;
  Table *pTab;
  int n;
  Expr *in_stack_ffffffffffffffc8;
  undefined5 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd5;
  char cVar3;
  undefined2 in_stack_ffffffffffffffd6;
  sqlite3 *db_00;
  int local_1c;
  char *local_8;
  
  db_00 = *(sqlite3 **)(in_RSI + 0x18);
  pvVar2 = sqlite3DbMallocRaw(db_00,CONCAT26(in_stack_ffffffffffffffd6,
                                             CONCAT15(in_stack_ffffffffffffffd5,
                                                      in_stack_ffffffffffffffd0)));
  *(void **)(in_RSI + 0x20) = pvVar2;
  if (*(long *)(in_RSI + 0x20) == 0) {
    sqlite3OomFault((sqlite3 *)
                    CONCAT26(in_stack_ffffffffffffffd6,
                             CONCAT15(in_stack_ffffffffffffffd5,in_stack_ffffffffffffffd0)));
    local_8 = (char *)0x0;
  }
  else {
    for (local_1c = 0; local_1c < (int)(uint)*(ushort *)(in_RSI + 0x60); local_1c = local_1c + 1) {
      sVar1 = *(short *)(*(long *)(in_RSI + 8) + (long)local_1c * 2);
      if (sVar1 < 0) {
        if (sVar1 == -1) {
          cVar3 = 'D';
        }
        else {
          cVar3 = sqlite3ExprAffinity(in_stack_ffffffffffffffc8);
        }
      }
      else {
        cVar3 = *(char *)((long)&db_00->pVdbe->ppVPrev + (long)sVar1 * 0x10 + 1);
      }
      if (cVar3 < 'A') {
        cVar3 = 'A';
      }
      if ('C' < cVar3) {
        cVar3 = 'C';
      }
      *(char *)(*(long *)(in_RSI + 0x20) + (long)local_1c) = cVar3;
    }
    *(undefined1 *)(*(long *)(in_RSI + 0x20) + (long)local_1c) = 0;
    local_8 = *(char **)(in_RSI + 0x20);
  }
  return local_8;
}

Assistant:

static SQLITE_NOINLINE const char *computeIndexAffStr(sqlite3 *db, Index *pIdx){
  /* The first time a column affinity string for a particular index is
  ** required, it is allocated and populated here. It is then stored as
  ** a member of the Index structure for subsequent use.
  **
  ** The column affinity string will eventually be deleted by
  ** sqliteDeleteIndex() when the Index structure itself is cleaned
  ** up.
  */
  int n;
  Table *pTab = pIdx->pTable;
  pIdx->zColAff = (char *)sqlite3DbMallocRaw(0, pIdx->nColumn+1);
  if( !pIdx->zColAff ){
    sqlite3OomFault(db);
    return 0;
  }
  for(n=0; n<pIdx->nColumn; n++){
    i16 x = pIdx->aiColumn[n];
    char aff;
    if( x>=0 ){
      aff = pTab->aCol[x].affinity;
    }else if( x==XN_ROWID ){
      aff = SQLITE_AFF_INTEGER;
    }else{
      assert( x==XN_EXPR );
      assert( pIdx->bHasExpr );
      assert( pIdx->aColExpr!=0 );
      aff = sqlite3ExprAffinity(pIdx->aColExpr->a[n].pExpr);
    }
    if( aff<SQLITE_AFF_BLOB ) aff = SQLITE_AFF_BLOB;
    if( aff>SQLITE_AFF_NUMERIC) aff = SQLITE_AFF_NUMERIC;
    pIdx->zColAff[n] = aff;
  }
  pIdx->zColAff[n] = 0;
  return pIdx->zColAff;
}